

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simul.cpp
# Opt level: O3

void __thiscall MetaSim::Simulation::run(Simulation *this,Tick endTick,int nRuns)

{
  Tick *pTVar1;
  bool bVar2;
  ostream *poVar3;
  Tick TVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  EVP_PKEY_CTX *ctx;
  
  bVar2 = -2 < nRuns;
  if (nRuns < -1) {
    pcVar7 = "Initialize stats";
    lVar6 = 0x10;
LAB_0011c43a:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    this->numRuns = 1;
    ctx = (EVP_PKEY_CTX *)0x1;
LAB_0011c47a:
    BaseStat::init(ctx);
    this->end = false;
    this->actRuns = 0;
    (this->globTime).v = 0;
    if (this->numRuns == 0) goto LAB_0011c5f1;
  }
  else {
    if (nRuns == 1) {
      pcVar7 = "One single run";
      lVar6 = 0xe;
      goto LAB_0011c43a;
    }
    if (nRuns != 0) {
      if (nRuns == -1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Will not initialize stats",0x19);
        bVar2 = false;
        goto LAB_0011c4b9;
      }
      ctx = (EVP_PKEY_CTX *)(ulong)(uint)nRuns;
      this->numRuns = (size_t)ctx;
      bVar2 = true;
      if (nRuns == 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Warning: Simulation cannot be initialized with 2 runs",
                   0x35);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
        std::ostream::put('\x10');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"         Executing 3 runs!",0x1a);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
        std::ostream::put('\x10');
        std::ostream::flush();
        this->numRuns = 3;
        ctx = (EVP_PKEY_CTX *)0x3;
      }
      goto LAB_0011c47a;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Last Sim in the batch",0x15);
    bVar2 = true;
LAB_0011c4b9:
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    this->numRuns = 1;
    this->actRuns = 0;
  }
  pTVar1 = &this->globTime;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n Run #",7);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pTVar1->v = 0;
    Entity::callNewRun();
    BaseStat::newRun();
    TVar4.v = pTVar1->v;
    while (TVar4.v < endTick.v) {
      TVar4 = sim_step(this);
      pTVar1->v = TVar4.v;
    }
    Entity::callEndRun();
    BaseStat::endRun();
    clearEventQueue(this);
    uVar5 = this->actRuns + 1;
    this->actRuns = uVar5;
  } while (uVar5 < this->numRuns);
LAB_0011c5f1:
  this->end = true;
  if (bVar2) {
    BaseStat::endSim();
    return;
  }
  return;
}

Assistant:

void Simulation::run(Tick endTick, int nRuns) 
    {
        DBGENTER(_SIMUL_DBG_LEV);
        bool initializeRuns = true;
        bool terminateSim = true;
	
        if (nRuns < -1) {
            cout << "Initialize stats" << endl;
            initializeRuns = true;
            terminateSim = false;
            numRuns = 1;
            nRuns = -nRuns;
        }
        else if (nRuns == -1) {
            cout << "Will not initialize stats" << endl;
            initializeRuns = false;
            terminateSim = false;
            numRuns = 1;
        }
        else if (nRuns == 0) {
            cout << "Last Sim in the batch" << endl;
            initializeRuns = false;
            terminateSim = true;
            numRuns = 1;	    
        }
        else if (nRuns == 1) {
            cout << "One single run" << endl;
            initializeRuns = true;
            terminateSim = true; 
            numRuns = 1;	    
        }
        else numRuns = nRuns;

        if (numRuns == 2) {
            cout << "Warning: Simulation cannot be "
                "initialized with 2 runs" << endl;
            cout << "         Executing 3 runs!" << endl;
            numRuns = 3;
        }

        if (initializeRuns) initRuns(numRuns);

        // Ok, now starts the main cycle of the simulation.
        // remember that actRuns is the actual run number
        // while numRuns is the maximum number of runs.
        actRuns = 0;
        while (actRuns < numRuns) {
            cout << "\n Run #" << actRuns << endl;

            initSingleRun();

            // MAIN CYCLE!!
            try {
                while (globTime < endTick) {
                    globTime = sim_step();
                }
            } catch (NoMoreEventsInQueue &e) {
                cerr << "No more events in queue: simulation time =" 
                     << globTime << endl;
            }

            endSingleRun();
                                
            actRuns++;   // next run....
        }
        end = true;
        if (terminateSim) endSim();      // the simulation is over!!
    }